

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::AddString
          (Reflection *this,Message *message,FieldDescriptor *field,string *value)

{
  string_view src;
  string *field_00;
  FieldDescriptor *message_00;
  bool bVar1;
  CppType CVar2;
  int number;
  CppStringType CVar3;
  Reflection *pRVar4;
  Descriptor *actual;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  Cord local_68 [2];
  string local_48;
  string *local_28;
  string *value_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_28 = value;
  value_local = (string *)field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  pRVar4 = Message::GetReflection(message);
  if (this != pRVar4) {
    pDVar5 = this->descriptor_;
    actual = Message::GetDescriptor((Message *)field_local);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar5,actual,(FieldDescriptor *)value_local,"AddString");
  }
  pDVar5 = FieldDescriptor::containing_type((FieldDescriptor *)value_local);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,(FieldDescriptor *)value_local,"AddString",
               "Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)value_local);
  if (!bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,(FieldDescriptor *)value_local,"AddString",
               "Field is singular; the method requires a repeated field.");
  }
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)value_local);
  if (CVar2 != CPPTYPE_STRING) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,(FieldDescriptor *)value_local,"AddString",CPPTYPE_STRING);
  }
  bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)value_local);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number((FieldDescriptor *)value_local);
    bVar1 = FieldDescriptor::requires_utf8_validation((FieldDescriptor *)value_local);
    std::__cxx11::string::string((string *)&local_48,(string *)value);
    internal::ExtensionSet::AddString
              (this_00,number,!bVar1 * '\x03' + '\t',&local_48,(FieldDescriptor *)value_local);
    std::__cxx11::string::~string((string *)&local_48);
    return;
  }
  CVar3 = FieldDescriptor::cpp_string_type((FieldDescriptor *)value_local);
  message_00 = field_local;
  field_00 = value_local;
  if (CVar3 != kView) {
    if (CVar3 == kCord) {
      src = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)value);
      absl::lts_20250127::Cord::Cord(local_68,src);
      AddField<absl::lts_20250127::Cord>
                (this,(Message *)message_00,(FieldDescriptor *)field_00,local_68);
      absl::lts_20250127::Cord::~Cord(local_68);
      return;
    }
    if (CVar3 != kString) {
      return;
    }
  }
  pbVar6 = AddField<std::__cxx11::string>
                     (this,(Message *)field_local,(FieldDescriptor *)value_local);
  std::__cxx11::string::assign((string *)pbVar6);
  return;
}

Assistant:

void Reflection::AddString(Message* message, const FieldDescriptor* field,
                           std::string value) const {
  USAGE_MUTABLE_CHECK_ALL(AddString, REPEATED, STRING);
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddString(field->number(),
                                            field->requires_utf8_validation()
                                                ? FieldDescriptor::TYPE_STRING
                                                : FieldDescriptor::TYPE_BYTES,
                                            std::move(value), field);
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        AddField<absl::Cord>(message, field, absl::Cord(value));
        break;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        AddField<std::string>(message, field)->assign(std::move(value));
        break;
    }
  }
}